

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O1

void __thiscall Js::ScopeInfo::ExtractScopeInfo(ScopeInfo *this,Parser *parser,Scope *scope)

{
  uint uVar1;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  SymbolType symbolType;
  ushort uVar4;
  PropertyId PVar5;
  undefined4 *puVar6;
  PropertyRecord *pPVar7;
  Symbol *this_01;
  int iVar8;
  undefined1 local_68 [8];
  SymbolName symName;
  
  uVar4 = ((ushort)*(undefined4 *)&scope->field_0x44 & 0xffef) +
          ((ushort)*(undefined4 *)&this->field_0x10 & 4) * 4;
  *(ushort *)&scope->field_0x44 = uVar4;
  uVar4 = (uVar4 & 0xfeff) + ((ushort)*(undefined4 *)&this->field_0x10 & 0x20) * 8;
  *(ushort *)&scope->field_0x44 = uVar4;
  *(ushort *)&scope->field_0x44 = uVar4 & 0xfffe | *(ushort *)&this->field_0x10 & 1;
  if ((this->field_0x10 & 2) != 0) {
    Scope::SetIsObject(scope);
  }
  if (parser == (Parser *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0xed,"(parser)","parser");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this_00 = parser->m_scriptContext;
  if (((this->field_0x10 & 0x10) == 0) &&
     (bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,CacheScopeInfoNamesPhase), !bVar3)) {
    if (0 < this->symbolCount) {
      iVar8 = 0;
      do {
        PVar5 = GetSymbolId(this,iVar8);
        if (PVar5 != 0) {
          pPVar7 = ScriptContext::GetPropertyName(this_00,PVar5);
          SetPropertyName(this,iVar8,pPVar7);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->symbolCount);
    }
    this->field_0x10 = this->field_0x10 | 0x10;
  }
  if (0 < this->symbolCount) {
    symName._8_8_ = &DAT_015cd718;
    iVar8 = 0;
    do {
      if ((this->field_0x10 & 0x10) == 0) {
        PVar5 = GetSymbolId(this,iVar8);
        if (PVar5 == 0) {
          pPVar7 = (PropertyRecord *)0x0;
        }
        else {
          pPVar7 = ScriptContext::GetPropertyName(this_00,PVar5);
        }
      }
      else {
        pPVar7 = GetPropertyName(this,iVar8);
      }
      if (pPVar7 != (PropertyRecord *)0x0) {
        symbolType = GetSymbolType(this,iVar8);
        uVar1 = pPVar7->byteCount;
        Memory::Recycler::WBSetBit((char *)local_68);
        local_68 = (undefined1  [8])(pPVar7 + 1);
        Memory::RecyclerWriteBarrierManager::WriteBarrier((SymbolName *)local_68);
        symName.string.ptr._0_4_ = uVar1 >> 1;
        this_01 = (Symbol *)new<Memory::ArenaAllocator>(0x50,&parser->m_nodeAllocator,0x366bee);
        Symbol::Symbol(this_01,(SymbolName *)local_68,(ParseNode *)0x0,symbolType);
        this_01->scopeSlot = iVar8;
        bVar3 = GetIsBlockVariable(this,iVar8);
        *(ushort *)&this_01->field_0x42 =
             (*(ushort *)&this_01->field_0x42 & 0xfffd) + (ushort)bVar3 * 2;
        bVar3 = GetIsConst(this,iVar8);
        *(ushort *)&this_01->field_0x42 =
             (*(ushort *)&this_01->field_0x42 & 0xfffb) + (ushort)bVar3 * 4;
        bVar3 = GetIsFuncExpr(this,iVar8);
        *(ushort *)&this_01->field_0x42 =
             *(ushort *)&this_01->field_0x42 & 0xffdf | (ushort)bVar3 << 5;
        bVar3 = GetIsModuleExportStorage(this,iVar8);
        *(ushort *)&this_01->field_0x42 =
             *(ushort *)&this_01->field_0x42 & 0xbfff | (ushort)bVar3 << 0xe;
        bVar3 = GetIsModuleImport(this,iVar8);
        *(ushort *)&this_01->field_0x42 =
             *(ushort *)&this_01->field_0x42 & 0x7fff | (ushort)bVar3 << 0xf;
        bVar3 = GetNeedDeclaration(this,iVar8);
        *(ushort *)&this_01->field_0x42 = *(ushort *)&this_01->field_0x42 & 0xfffe | (ushort)bVar3;
        bVar3 = GetHasFuncAssignment(this,iVar8);
        if (bVar3) {
          Symbol::RestoreHasFuncAssignment(this_01);
        }
        Scope::AddNewSymbol(scope,this_01);
        Symbol::SetHasNonLocalReference(this_01);
        Parser::RestorePidRefForSym(parser,this_01);
        bVar3 = Phases::IsEnabled((Phases *)symName._8_8_,ByteCodePhase);
        if (bVar3) {
          Output::Print(L"%12s %d\n",(this_01->name).string.ptr,(ulong)(uint)this_01->scopeSlot);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->symbolCount);
  }
  this->scope = scope;
  scope->field_0x45 = scope->field_0x45 | 8;
  return;
}

Assistant:

void ScopeInfo::ExtractScopeInfo(Parser *parser, /*ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo,*/ Scope* scope)
    {
        ScriptContext* scriptContext;
        ArenaAllocator* alloc;

        // Load scope attributes and push onto scope stack.
        scope->SetMustInstantiate(this->mustInstantiate);
        scope->SetHasOwnLocalInClosure(this->hasLocalInClosure);
        scope->SetIsDynamic(this->isDynamic);
        if (this->isObject)
        {
            scope->SetIsObject();
        }

        Assert(parser);

        scriptContext = parser->GetScriptContext();
        alloc = parser->GetAllocator();

        // Load scope symbols
        // On first access to the scopeinfo, replace the ID's with PropertyRecord*'s to save the dictionary lookup
        // on later accesses. Replace them all before allocating Symbol's to prevent inconsistency on OOM.
        if (!this->areNamesCached && !PHASE_OFF1(Js::CacheScopeInfoNamesPhase))
        {
            for (int i = 0; i < symbolCount; i++)
            {
                PropertyId propertyId = GetSymbolId(i);
                if (propertyId != 0) // There may be empty slots, e.g. "arguments" may have no slot
                {
                    PropertyRecord const* name = scriptContext->GetPropertyName(propertyId);
                    this->SetPropertyName(i, name);
                }
            }
            this->areNamesCached = true;
        }

        for (int i = 0; i < symbolCount; i++)
        {
            PropertyRecord const* name = nullptr;
            if (this->areNamesCached)
            {
                name = this->GetPropertyName(i);
            }
            else
            {
                PropertyId propertyId = GetSymbolId(i);
                if (propertyId != 0) // There may be empty slots, e.g. "arguments" may have no slot
                {
                    name = scriptContext->GetPropertyName(propertyId);
                }
            }

            if (name != nullptr)
            {
                SymbolType symbolType = GetSymbolType(i);
                SymbolName symName(name->GetBuffer(), name->GetLength());
                Symbol *sym = Anew(alloc, Symbol, symName, nullptr, symbolType);

                sym->SetScopeSlot(static_cast<PropertyId>(i));
                sym->SetIsBlockVar(GetIsBlockVariable(i));
                sym->SetIsConst(GetIsConst(i));
                sym->SetIsFuncExpr(GetIsFuncExpr(i));
                sym->SetIsModuleExportStorage(GetIsModuleExportStorage(i));
                sym->SetIsModuleImport(GetIsModuleImport(i));
                sym->SetNeedDeclaration(GetNeedDeclaration(i));
                if (GetHasFuncAssignment(i))
                {
                    sym->RestoreHasFuncAssignment();
                }
                scope->AddNewSymbol(sym);
                sym->SetHasNonLocalReference();
                Assert(parser);
                parser->RestorePidRefForSym(sym);

                TRACE_BYTECODE(_u("%12s %d\n"), sym->GetName().GetBuffer(), sym->GetScopeSlot());
            }
        }
        this->scope = scope;
        DebugOnly(scope->isRestored = true);
    }